

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamFtp::Close(BamFtp *this)

{
  TcpSocket::DisconnectFromHost(this->m_commandSocket);
  TcpSocket::DisconnectFromHost(this->m_dataSocket);
  this->m_isUrlParsed = false;
  this->m_filePosition = -1;
  std::__cxx11::string::_M_assign((string *)&this->m_username);
  std::__cxx11::string::_M_assign((string *)&this->m_password);
  (this->m_dataHostname)._M_string_length = 0;
  *(this->m_dataHostname)._M_dataplus._M_p = '\0';
  this->m_dataPort = 0;
  return;
}

Assistant:

void BamFtp::Close(void) {

    // disconnect socket
    m_commandSocket->DisconnectFromHost();
    m_dataSocket->DisconnectFromHost();

    // reset state - necessary??
    m_isUrlParsed = false;
    m_filePosition = -1;
    m_username = DEFAULT_USER;
    m_password = DEFAULT_PASS;
    m_dataHostname.clear();
    m_dataPort = 0;
}